

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<bool>::resize(QList<bool> *this,qsizetype size)

{
  qsizetype qVar1;
  QArrayDataPointer<bool> *in_RSI;
  QArrayDataPointer<bool> *in_RDI;
  QList<bool> *unaff_retaddr;
  QArrayDataPointer<bool> *this_00;
  
  resize_internal(unaff_retaddr,(qsizetype)in_RDI);
  this_00 = in_RSI;
  qVar1 = QList<bool>::size((QList<bool> *)in_RDI);
  if (qVar1 < (long)in_RSI) {
    QArrayDataPointer<bool>::operator->(in_RDI);
    QArrayDataPointer<bool>::appendInitialize(this_00,(qsizetype)in_RSI);
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }